

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::fixAfterChanges::Fixer::replace(Fixer *this)

{
  TranslateToFuzzReader *this_00;
  Expression *pEVar1;
  Fixer *this_local;
  
  this_00 = this->parent;
  pEVar1 = Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::getCurrent
                     ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)this);
  pEVar1 = makeTrivial(this_00,(Type)(pEVar1->type).id);
  ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::replaceCurrent
            (&this->super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
             ,pEVar1);
  return;
}

Assistant:

void replace() { replaceCurrent(parent.makeTrivial(getCurrent()->type)); }